

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

void duckdb_je_emap_do_assert_mapped(tsdn_t *tsdn,emap_t *emap,edata_t *edata)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  void *pvVar3;
  rtree_leaf_elm_t *prVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_cache_elm_t *prVar10;
  rtree_ctx_t *ctx;
  bool bVar11;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1a0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1a0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar3 = edata->e_addr;
  uVar6 = (ulong)pvVar3 & 0xffffffffc0000000;
  uVar7 = (ulong)(((uint)((ulong)pvVar3 >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar7);
  uVar7 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar7);
  if (uVar7 != uVar6) {
    if (ctx->l2_cache[0].leafkey == uVar6) {
      prVar4 = ctx->l2_cache[0].leaf;
      ctx->l2_cache[0].leafkey = uVar7;
      ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar6;
      puVar2[1] = (ulong)prVar4;
    }
    else {
      prVar9 = ctx->l2_cache + 1;
      if (ctx->l2_cache[1].leafkey == uVar6) {
        uVar8 = 0;
        bVar11 = false;
      }
      else {
        uVar5 = 1;
        prVar10 = prVar9;
        do {
          uVar8 = uVar5;
          bVar11 = 6 < uVar8;
          if (uVar8 == 7) goto LAB_01194af9;
          prVar9 = prVar10 + 1;
          prVar1 = prVar10 + 1;
          uVar5 = uVar8 + 1;
          prVar10 = prVar9;
        } while (prVar1->leafkey != uVar6);
        bVar11 = 6 < uVar8;
      }
      prVar4 = prVar9->leaf;
      prVar9->leafkey = ctx->l2_cache[uVar8].leafkey;
      prVar9->leaf = ctx->l2_cache[uVar8].leaf;
      ctx->l2_cache[uVar8].leafkey = uVar7;
      ctx->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar6;
      puVar2[1] = (ulong)prVar4;
LAB_01194af9:
      if (bVar11) {
        duckdb_je_rtree_leaf_elm_lookup_hard
                  (tsdn,&emap->rtree,ctx,(ulong)pvVar3 & 0xfffffffffffff000,true,false);
      }
    }
  }
  return;
}

Assistant:

void
emap_do_assert_mapped(tsdn_t *tsdn, emap_t *emap, edata_t *edata) {
	EMAP_DECLARE_RTREE_CTX;

	rtree_contents_t contents = rtree_read(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_base_get(edata));
	assert(contents.edata == edata);
	assert(contents.metadata.is_head == edata_is_head_get(edata));
	assert(contents.metadata.state == edata_state_get(edata));
}